

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int windowCodeOp(WindowCodeArg *p,int op,int regCountdown,int jumpOnEof)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  bool bVar1;
  int regTmp;
  int nReg;
  int regRowid2;
  int regRowid1;
  int addrNextRange;
  int lblDone;
  int bPeer;
  int addrContinue;
  Vdbe *v;
  int ret;
  Window *pMWin;
  Parse *pParse;
  int reg;
  int csr;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Parse *in_stack_ffffffffffffff78;
  Parse *pParse_00;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int iVar2;
  Vdbe *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int iVar3;
  int in_stack_ffffffffffffff9c;
  int iVar4;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_58;
  undefined4 in_stack_ffffffffffffffc0;
  long lVar5;
  int iVar6;
  Parse *pParse_01;
  int in_stack_ffffffffffffffd8;
  int iVar7;
  undefined4 uVar8;
  int local_4;
  
  uVar8 = 0xaaaaaaaa;
  iVar7 = -0x55555556;
  pParse_01 = (Parse *)*in_RDI;
  lVar5 = in_RDI[1];
  local_4 = 0;
  pParse_00 = (Parse *)in_RDI[2];
  bVar1 = *(char *)(lVar5 + 0x20) != 'M';
  sqlite3VdbeMakeLabel(pParse_01);
  local_58 = 0;
  if ((in_ESI == 2) && (*(char *)(lVar5 + 0x21) == '[')) {
    local_4 = 0;
  }
  else {
    if (0 < in_EDX) {
      if (*(char *)(lVar5 + 0x20) == 'Z') {
        local_58 = sqlite3VdbeCurrentAddr((Vdbe *)pParse_00);
        iVar6 = (int)((ulong)lVar5 >> 0x20);
        iVar2 = (int)pParse_01;
        iVar4 = (int)((ulong)pParse_01 >> 0x20);
        if (in_ESI == 2) {
          if (*(char *)(lVar5 + 0x21) == 'W') {
            windowCodeRangeTest((WindowCodeArg *)CONCAT44(in_ECX,uVar8),iVar7,
                                in_stack_ffffffffffffffd8,iVar4,iVar2,iVar6);
          }
          else {
            windowCodeRangeTest((WindowCodeArg *)CONCAT44(in_ECX,uVar8),iVar7,
                                in_stack_ffffffffffffffd8,iVar4,iVar2,iVar6);
          }
        }
        else {
          windowCodeRangeTest((WindowCodeArg *)CONCAT44(in_ECX,uVar8),iVar7,
                              in_stack_ffffffffffffffd8,iVar4,iVar2,iVar6);
        }
      }
      else {
        sqlite3VdbeAddOp3(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                          in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                          (int)in_stack_ffffffffffffff78);
      }
    }
    if ((in_ESI == 1) && (*(int *)(lVar5 + 0x84) == 0)) {
      windowAggFinal((WindowCodeArg *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c);
    }
    sqlite3VdbeCurrentAddr((Vdbe *)pParse_00);
    if (((*(char *)(lVar5 + 0x21) == *(char *)(lVar5 + 0x22)) && (in_EDX != 0)) &&
       (*(char *)(lVar5 + 0x20) == 'Z')) {
      in_stack_ffffffffffffffa4 = sqlite3GetTempReg(pParse_01);
      in_stack_ffffffffffffffa0 = sqlite3GetTempReg(pParse_01);
      if (in_ESI == 2) {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
        sqlite3VdbeAddOp3(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                          in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                          (int)in_stack_ffffffffffffff78);
      }
      else if (*(int *)(in_RDI + 5) != 0) {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
        sqlite3VdbeAddOp3(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                          in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                          (int)in_stack_ffffffffffffff78);
      }
      sqlite3ReleaseTempReg(pParse_01,in_stack_ffffffffffffffa4);
      sqlite3ReleaseTempReg(pParse_01,in_stack_ffffffffffffffa0);
    }
    iVar6 = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    iVar7 = in_ESI;
    if (in_ESI == 1) {
      iVar2 = *(int *)((long)in_RDI + 0x34);
      windowReturnOneRow((WindowCodeArg *)CONCAT44(local_4,in_stack_ffffffffffffffc0));
    }
    else {
      iVar4 = (int)((ulong)lVar5 >> 0x20);
      iVar3 = (int)((ulong)pParse_01 >> 0x20);
      if (in_ESI == 2) {
        iVar2 = *(int *)((long)in_RDI + 0x2c);
        if (*(int *)(lVar5 + 0x84) == 0) {
          windowAggStep((WindowCodeArg *)CONCAT44(in_ECX,iVar2),
                        (Window *)CONCAT44(*(undefined4 *)(in_RDI + 6),in_stack_ffffffffffffffd8),
                        iVar3,(int)pParse_01,iVar4);
        }
        else {
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
        }
      }
      else {
        iVar2 = *(int *)((long)in_RDI + 0x3c);
        if (*(int *)(lVar5 + 0x84) == 0) {
          windowAggStep((WindowCodeArg *)CONCAT44(in_ECX,iVar2),
                        (Window *)CONCAT44(*(undefined4 *)(in_RDI + 8),in_stack_ffffffffffffffd8),
                        iVar3,(int)pParse_01,iVar4);
        }
        else {
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
        }
      }
    }
    if (in_ESI == *(int *)((long)in_RDI + 0x24)) {
      sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      sqlite3VdbeChangeP5((Vdbe *)pParse_00,2);
    }
    if (in_ECX == 0) {
      sqlite3VdbeCurrentAddr((Vdbe *)pParse_00);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
      if (bVar1) {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
      }
    }
    else {
      sqlite3VdbeCurrentAddr((Vdbe *)pParse_00);
      iVar6 = (int)((ulong)pParse_00 >> 0x20);
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
      in_stack_ffffffffffffff90 = iVar2;
      local_4 = sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c);
      pParse_00 = in_stack_ffffffffffffff78;
      iVar2 = in_stack_ffffffffffffff84;
    }
    if (bVar1) {
      if (*(long *)(lVar5 + 0x18) == 0) {
        in_stack_ffffffffffffff74 = 0;
      }
      else {
        in_stack_ffffffffffffff74 = **(int **)(lVar5 + 0x18);
      }
      iVar4 = in_stack_ffffffffffffff74;
      if (in_stack_ffffffffffffff74 == 0) {
        in_stack_ffffffffffffff70 = 0;
      }
      else {
        in_stack_ffffffffffffff70 = sqlite3GetTempRange(pParse_00,in_stack_ffffffffffffff74);
      }
      iVar3 = in_stack_ffffffffffffff70;
      windowReadPeerValues
                ((WindowCodeArg *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 iVar4,in_stack_ffffffffffffff70);
      windowIfNewPeer((Parse *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (ExprList *)CONCAT44(iVar4,iVar3),iVar7,in_stack_ffffffffffffff90,iVar6);
      sqlite3ReleaseTempRange
                ((Parse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    }
    iVar7 = (int)((ulong)pParse_00 >> 0x20);
    if (local_58 != 0) {
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
    }
    sqlite3VdbeResolveLabel((Vdbe *)CONCAT44(iVar2,in_stack_ffffffffffffff80),iVar7);
  }
  return local_4;
}

Assistant:

static int windowCodeOp(
 WindowCodeArg *p,                /* Context object */
 int op,                          /* WINDOW_RETURN_ROW, AGGSTEP or AGGINVERSE */
 int regCountdown,                /* Register for OP_IfPos countdown */
 int jumpOnEof                    /* Jump here if stepped cursor reaches EOF */
){
  int csr, reg;
  Parse *pParse = p->pParse;
  Window *pMWin = p->pMWin;
  int ret = 0;
  Vdbe *v = p->pVdbe;
  int addrContinue = 0;
  int bPeer = (pMWin->eFrmType!=TK_ROWS);

  int lblDone = sqlite3VdbeMakeLabel(pParse);
  int addrNextRange = 0;

  /* Special case - WINDOW_AGGINVERSE is always a no-op if the frame
  ** starts with UNBOUNDED PRECEDING. */
  if( op==WINDOW_AGGINVERSE && pMWin->eStart==TK_UNBOUNDED ){
    assert( regCountdown==0 && jumpOnEof==0 );
    return 0;
  }

  if( regCountdown>0 ){
    if( pMWin->eFrmType==TK_RANGE ){
      addrNextRange = sqlite3VdbeCurrentAddr(v);
      assert( op==WINDOW_AGGINVERSE || op==WINDOW_AGGSTEP );
      if( op==WINDOW_AGGINVERSE ){
        if( pMWin->eStart==TK_FOLLOWING ){
          windowCodeRangeTest(
              p, OP_Le, p->current.csr, regCountdown, p->start.csr, lblDone
          );
        }else{
          windowCodeRangeTest(
              p, OP_Ge, p->start.csr, regCountdown, p->current.csr, lblDone
          );
        }
      }else{
        windowCodeRangeTest(
            p, OP_Gt, p->end.csr, regCountdown, p->current.csr, lblDone
        );
      }
    }else{
      sqlite3VdbeAddOp3(v, OP_IfPos, regCountdown, lblDone, 1);
      VdbeCoverage(v);
    }
  }

  if( op==WINDOW_RETURN_ROW && pMWin->regStartRowid==0 ){
    windowAggFinal(p, 0);
  }
  addrContinue = sqlite3VdbeCurrentAddr(v);

  /* If this is a (RANGE BETWEEN a FOLLOWING AND b FOLLOWING) or
  ** (RANGE BETWEEN b PRECEDING AND a PRECEDING) frame, ensure the
  ** start cursor does not advance past the end cursor within the
  ** temporary table. It otherwise might, if (a>b). Also ensure that,
  ** if the input cursor is still finding new rows, that the end
  ** cursor does not go past it to EOF. */
  if( pMWin->eStart==pMWin->eEnd && regCountdown
   && pMWin->eFrmType==TK_RANGE
  ){
    int regRowid1 = sqlite3GetTempReg(pParse);
    int regRowid2 = sqlite3GetTempReg(pParse);
    if( op==WINDOW_AGGINVERSE ){
      sqlite3VdbeAddOp2(v, OP_Rowid, p->start.csr, regRowid1);
      sqlite3VdbeAddOp2(v, OP_Rowid, p->end.csr, regRowid2);
      sqlite3VdbeAddOp3(v, OP_Ge, regRowid2, lblDone, regRowid1);
      VdbeCoverage(v);
    }else if( p->regRowid ){
      sqlite3VdbeAddOp2(v, OP_Rowid, p->end.csr, regRowid1);
      sqlite3VdbeAddOp3(v, OP_Ge, p->regRowid, lblDone, regRowid1);
      VdbeCoverageNeverNull(v);
    }
    sqlite3ReleaseTempReg(pParse, regRowid1);
    sqlite3ReleaseTempReg(pParse, regRowid2);
    assert( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_FOLLOWING );
  }

  switch( op ){
    case WINDOW_RETURN_ROW:
      csr = p->current.csr;
      reg = p->current.reg;
      windowReturnOneRow(p);
      break;

    case WINDOW_AGGINVERSE:
      csr = p->start.csr;
      reg = p->start.reg;
      if( pMWin->regStartRowid ){
        assert( pMWin->regEndRowid );
        sqlite3VdbeAddOp2(v, OP_AddImm, pMWin->regStartRowid, 1);
      }else{
        windowAggStep(p, pMWin, csr, 1, p->regArg);
      }
      break;

    default:
      assert( op==WINDOW_AGGSTEP );
      csr = p->end.csr;
      reg = p->end.reg;
      if( pMWin->regStartRowid ){
        assert( pMWin->regEndRowid );
        sqlite3VdbeAddOp2(v, OP_AddImm, pMWin->regEndRowid, 1);
      }else{
        windowAggStep(p, pMWin, csr, 0, p->regArg);
      }
      break;
  }

  if( op==p->eDelete ){
    sqlite3VdbeAddOp1(v, OP_Delete, csr);
    sqlite3VdbeChangeP5(v, OPFLAG_SAVEPOSITION);
  }

  if( jumpOnEof ){
    sqlite3VdbeAddOp2(v, OP_Next, csr, sqlite3VdbeCurrentAddr(v)+2);
    VdbeCoverage(v);
    ret = sqlite3VdbeAddOp0(v, OP_Goto);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, csr, sqlite3VdbeCurrentAddr(v)+1+bPeer);
    VdbeCoverage(v);
    if( bPeer ){
      sqlite3VdbeAddOp2(v, OP_Goto, 0, lblDone);
    }
  }

  if( bPeer ){
    int nReg = (pMWin->pOrderBy ? pMWin->pOrderBy->nExpr : 0);
    int regTmp = (nReg ? sqlite3GetTempRange(pParse, nReg) : 0);
    windowReadPeerValues(p, csr, regTmp);
    windowIfNewPeer(pParse, pMWin->pOrderBy, regTmp, reg, addrContinue);
    sqlite3ReleaseTempRange(pParse, regTmp, nReg);
  }

  if( addrNextRange ){
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrNextRange);
  }
  sqlite3VdbeResolveLabel(v, lblDone);
  return ret;
}